

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O2

Expression *
slang::ast::ReplicatedAssignmentPatternExpression::bindReplCount
          (Compilation *comp,ExpressionSyntax *syntax,ASTContext *context,size_t *count)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  optional<int> value;
  Expression *pEVar3;
  
  iVar2 = Expression::bind((int)syntax,(sockaddr *)context,0);
  pEVar3 = (Expression *)CONCAT44(extraout_var,iVar2);
  value = ASTContext::evalInteger(context,pEVar3,(bitmask<slang::ast::EvalFlags>)0x0);
  bVar1 = ASTContext::requireGtZero(context,value,pEVar3->sourceRange);
  if (bVar1) {
    *count = (long)value.super__Optional_base<int,_true,_true>._M_payload.
                   super__Optional_payload_base<int>._M_payload;
    return pEVar3;
  }
  pEVar3 = Expression::badExpr(comp,pEVar3);
  return pEVar3;
}

Assistant:

const Expression& ReplicatedAssignmentPatternExpression::bindReplCount(
    Compilation& comp, const ExpressionSyntax& syntax, const ASTContext& context, size_t& count) {

    const Expression& expr = bind(syntax, context);
    std::optional<int32_t> c = context.evalInteger(expr);
    if (!context.requireGtZero(c, expr.sourceRange))
        return badExpr(comp, &expr);

    count = size_t(*c);
    return expr;
}